

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

wstring * __thiscall
mjs::interpreter::impl::stack_trace_abi_cxx11_(wstring *__return_storage_ptr__,impl *this)

{
  pointer psVar1;
  pointer psVar2;
  wostream *os;
  source_extend *extend;
  wostringstream woss;
  wostringstream awStack_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::wostringstream::wostringstream(awStack_1a8);
  if ((this->current_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    __assert_fail("current_extend_.file",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x525,"std::wstring mjs::interpreter::impl::stack_trace() const");
  }
  mjs::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)awStack_1a8,
                  &this->current_extend_);
  psVar1 = (this->stack_trace_).
           super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar2 = (this->stack_trace_).
           super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    extend = psVar2 + -1;
    if (psVar2 == psVar1) {
      std::__cxx11::wstringbuf::str();
      std::__cxx11::wostringstream::~wostringstream(awStack_1a8);
      std::ios_base::~ios_base(local_138);
      return __return_storage_ptr__;
    }
    if ((extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) break;
    os = std::operator<<((wostream *)awStack_1a8,"\n");
    mjs::operator<<(os,extend);
    psVar2 = extend;
  }
  __assert_fail("it->file",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                ,0x528,"std::wstring mjs::interpreter::impl::stack_trace() const");
}

Assistant:

std::wstring stack_trace() const {
        std::wostringstream woss;
        assert(current_extend_.file);
        woss << current_extend_;
        for (auto it =  stack_trace_.crbegin(), end = stack_trace_.crend(); it != end; ++it) {
            assert(it->file);
            woss << "\n" << *it;
        }
        return woss.str();
    }